

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::AdvancedUsageUBO::Run(AdvancedUsageUBO *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *textures;
  GLuint *framebuffers;
  bool bVar1;
  GLuint GVar2;
  GLuint uniformBlockIndex;
  undefined4 *__s;
  undefined4 *puVar3;
  GLuint *ebo;
  GLuint i;
  undefined4 uVar4;
  long lVar5;
  bool in_stack_fffffffffffffbb8;
  GLuint *buffers_00;
  uint z;
  GLuint data [256];
  
  lVar5 = 0;
  GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter;\nlayout(std140) uniform Data {\n  uint index[256];\n} ub_data;\nvoid main() {\n  o_color = uvec4(ub_data.index[atomicCounterIncrement(ac_counter)]);\n}"
                     ,&DAT_00000001,in_stack_fffffffffffffbb8);
  this->prog_ = GVar2;
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  uniformBlockIndex = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar2,"Data");
  glu::CallLogWrapper::glUniformBlockBinding(this_00,GVar2,uniformBlockIndex,1);
  z = 0;
  buffers_00 = &this->counter_buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&z,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  __s = (undefined4 *)operator_new(0x1000);
  memset(__s,0,0x1000);
  puVar3 = __s;
  do {
    uVar4 = (undefined4)lVar5;
    *puVar3 = uVar4;
    puVar3[1] = uVar4;
    puVar3[2] = uVar4;
    puVar3[3] = uVar4;
    lVar5 = lVar5 + 1;
    puVar3 = puVar3 + 4;
  } while (lVar5 != 0x100);
  buffers = &this->uniform_buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,*buffers);
  glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x1000,__s,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,0);
  textures = &this->rt_;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,0x10,0x10,0,0x8d94,0x1405,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  framebuffers = &this->fbo_;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,framebuffers);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
  ebo = (GLuint *)(ulong)*textures;
  glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,*textures,0);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateQuad
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,*buffers_00);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,1,*buffers);
  glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
  GVar2 = 0x10;
  glu::CallLogWrapper::glReadPixels(this_00,0,0,0x10,0x10,0x8d94,0x1405,data);
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                    ((SACSubcaseBase *)0x100,(GLuint)data,(GLuint *)0x0,GVar2);
  lVar5 = -1;
  if (bVar1) {
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x100);
    lVar5 = (ulong)bVar1 - 1;
  }
  operator_delete(__s,0x1000);
  return lVar5;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out uvec4 o_color;" NL
			"layout(binding = 0, offset = 0) uniform atomic_uint ac_counter;" NL "layout(std140) uniform Data {" NL
			"  uint index[256];" NL "} ub_data;" NL "void main() {" NL
			"  o_color = uvec4(ub_data.index[atomicCounterIncrement(ac_counter)]);" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);
		glUniformBlockBinding(prog_, glGetUniformBlockIndex(prog_, "Data"), 1);

		// create atomic counter buffer
		const unsigned int z = 0;
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(z), &z, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create uniform buffer
		std::vector<UVec4> init_data(256);
		for (GLuint i	= 0; i < 256; ++i)
			init_data[i] = UVec4(i);
		glGenBuffers(1, &uniform_buffer_);
		glBindBuffer(GL_UNIFORM_BUFFER, uniform_buffer_);
		glBufferData(GL_UNIFORM_BUFFER, (GLsizeiptr)(sizeof(UVec4) * init_data.size()), &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		// create render targets
		const int s = 16;
		glGenTextures(1, &rt_);
		glBindTexture(GL_TEXTURE_2D, rt_);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_, 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_UNIFORM_BUFFER, 1, uniform_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// validate
		GLuint data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 0))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 0, 256))
			return ERROR;

		return NO_ERROR;
	}